

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugMacro.cpp
# Opt level: O0

void __thiscall llvm::DWARFDebugMacro::parse(DWARFDebugMacro *this,DataExtractor data)

{
  uint32_t uVar1;
  bool bVar2;
  reference pEVar3;
  uint64_t uVar4;
  char *pcVar5;
  Entry *E;
  MacroList *M;
  uint64_t Offset;
  DWARFDebugMacro *this_local;
  
  M = (MacroList *)0x0;
  E = (Entry *)0x0;
  Offset = (uint64_t)this;
  while( true ) {
    do {
      while( true ) {
        while( true ) {
          do {
            bVar2 = DataExtractor::isValidOffset(&data,(uint64_t)M);
            if (!bVar2) {
              return;
            }
            if (E == (Entry *)0x0) {
              std::
              vector<llvm::SmallVector<llvm::DWARFDebugMacro::Entry,_4U>,_std::allocator<llvm::SmallVector<llvm::DWARFDebugMacro::Entry,_4U>_>_>
              ::emplace_back<>(&this->MacroLists);
              E = (Entry *)std::
                           vector<llvm::SmallVector<llvm::DWARFDebugMacro::Entry,_4U>,_std::allocator<llvm::SmallVector<llvm::DWARFDebugMacro::Entry,_4U>_>_>
                           ::back(&this->MacroLists);
            }
            SmallVectorImpl<llvm::DWARFDebugMacro::Entry>::emplace_back<>
                      ((SmallVectorImpl<llvm::DWARFDebugMacro::Entry> *)E);
            pEVar3 = SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>::back
                               ((SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void> *)E);
            uVar4 = DataExtractor::getULEB128(&data,(uint64_t *)&M,(Error *)0x0);
            pEVar3->Type = (uint32_t)uVar4;
          } while (pEVar3->Type == 0);
          uVar1 = pEVar3->Type;
          if (1 < uVar1 - 1) break;
          uVar4 = DataExtractor::getULEB128(&data,(uint64_t *)&M,(Error *)0x0);
          (pEVar3->field_1).Line = uVar4;
          pcVar5 = DataExtractor::getCStr(&data,(uint64_t *)&M);
          (pEVar3->field_2).MacroStr = pcVar5;
        }
        if (uVar1 != 3) break;
        uVar4 = DataExtractor::getULEB128(&data,(uint64_t *)&M,(Error *)0x0);
        (pEVar3->field_1).Line = uVar4;
        uVar4 = DataExtractor::getULEB128(&data,(uint64_t *)&M,(Error *)0x0);
        (pEVar3->field_2).File = uVar4;
      }
    } while (uVar1 == 4);
    if (uVar1 != 0xff) break;
    uVar4 = DataExtractor::getULEB128(&data,(uint64_t *)&M,(Error *)0x0);
    (pEVar3->field_1).Line = uVar4;
    pcVar5 = DataExtractor::getCStr(&data,(uint64_t *)&M);
    (pEVar3->field_2).MacroStr = pcVar5;
  }
  pEVar3->Type = 0xffffffff;
  return;
}

Assistant:

void DWARFDebugMacro::parse(DataExtractor data) {
  uint64_t Offset = 0;
  MacroList *M = nullptr;
  while (data.isValidOffset(Offset)) {
    if (!M) {
      MacroLists.emplace_back();
      M = &MacroLists.back();
    }
    // A macro list entry consists of:
    M->emplace_back();
    Entry &E = M->back();
    // 1. Macinfo type
    E.Type = data.getULEB128(&Offset);

    if (E.Type == 0) {
      // Reached end of a ".debug_macinfo" section contribution.
      continue;
    }

    switch (E.Type) {
    default:
      // Got a corrupted ".debug_macinfo" section (invalid macinfo type).
      // Push the corrupted entry to the list and halt parsing.
      E.Type = DW_MACINFO_invalid;
      return;
    case DW_MACINFO_define:
    case DW_MACINFO_undef:
      // 2. Source line
      E.Line = data.getULEB128(&Offset);
      // 3. Macro string
      E.MacroStr = data.getCStr(&Offset);
      break;
    case DW_MACINFO_start_file:
      // 2. Source line
      E.Line = data.getULEB128(&Offset);
      // 3. Source file id
      E.File = data.getULEB128(&Offset);
      break;
    case DW_MACINFO_end_file:
      break;
    case DW_MACINFO_vendor_ext:
      // 2. Vendor extension constant
      E.ExtConstant = data.getULEB128(&Offset);
      // 3. Vendor extension string
      E.ExtStr = data.getCStr(&Offset);
      break;
    }
  }
}